

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O2

bool __thiscall helics::UnknownHandleManager::hasRequiredUnknowns(UnknownHandleManager *this)

{
  bool bVar1;
  
  bVar1 = std::
          any_of<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>,false,true>,helics::UnknownHandleManager::hasRequiredUnknowns()const::__0>
                    ((this->unknown_publications)._M_h._M_before_begin._M_nxt,0);
  if (!bVar1) {
    bVar1 = std::
            any_of<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>,false,true>,helics::UnknownHandleManager::hasRequiredUnknowns()const::__0>
                      ((this->unknown_inputs)._M_h._M_before_begin._M_nxt,0);
    if (!bVar1) {
      bVar1 = std::
              any_of<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>,false,true>,helics::UnknownHandleManager::hasRequiredUnknowns()const::__0>
                        ((this->unknown_endpoints)._M_h._M_before_begin._M_nxt,0);
      if (!bVar1) {
        bVar1 = std::
                any_of<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>,false,true>,helics::UnknownHandleManager::hasRequiredUnknowns()const::__0>
                          ((this->unknown_filters)._M_h._M_before_begin._M_nxt,0);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool UnknownHandleManager::hasRequiredUnknowns() const
{
    auto requiredCheck = [](const auto& uInterface) {
        return ((uInterface.second.second & make_flags(required_flag)) != 0);
    };
    return (
        (std::any_of(unknown_publications.begin(), unknown_publications.end(), requiredCheck)) ||
        (std::any_of(unknown_inputs.begin(), unknown_inputs.end(), requiredCheck)) ||
        (std::any_of(unknown_endpoints.begin(), unknown_endpoints.end(), requiredCheck)) ||
        (std::any_of(unknown_filters.begin(), unknown_filters.end(), requiredCheck)));
}